

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void sync_lr_workers(AVxWorker *workers,AV1_COMMON *cm,int num_workers)

{
  int iVar1;
  int in_EDX;
  long in_RDI;
  AVxWorker *worker_1;
  int i;
  AVxWorker *worker;
  aom_internal_error_info error_info;
  int had_error;
  AVxWorkerInterface *winterface;
  aom_internal_error_info *in_stack_fffffffffffffe18;
  aom_internal_error_info *in_stack_fffffffffffffe20;
  int local_1d4;
  undefined1 local_1c8 [420];
  int local_24;
  AVxWorkerInterface *local_20;
  int local_14;
  long local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = aom_get_worker_interface();
  local_24 = *(int *)(local_8 + 0x30);
  if (local_24 != 0) {
    memcpy(local_1c8,(void *)(*(long *)(local_8 + 0x28) + 0x20),0x1a0);
  }
  while (local_1d4 = local_14 + -1, 0 < local_1d4) {
    in_stack_fffffffffffffe20 = (aom_internal_error_info *)(local_8 + (long)local_1d4 * 0x38);
    iVar1 = (*local_20->sync)((AVxWorker *)in_stack_fffffffffffffe20);
    local_14 = local_1d4;
    if (iVar1 == 0) {
      local_24 = 1;
      memcpy(local_1c8,
             (void *)((long)*(void **)((long)in_stack_fffffffffffffe20->detail + 0x20) + 0x20),0x1a0
            );
    }
  }
  if (local_24 != 0) {
    aom_internal_error_copy(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  return;
}

Assistant:

static inline void sync_lr_workers(AVxWorker *const workers,
                                   AV1_COMMON *const cm, int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int had_error = workers[0].had_error;
  struct aom_internal_error_info error_info;

  // Read the error_info of main thread.
  if (had_error) {
    AVxWorker *const worker = &workers[0];
    error_info = ((LRWorkerData *)worker->data2)->error_info;
  }

  // Wait till all rows are finished.
  for (int i = num_workers - 1; i > 0; --i) {
    AVxWorker *const worker = &workers[i];
    if (!winterface->sync(worker)) {
      had_error = 1;
      error_info = ((LRWorkerData *)worker->data2)->error_info;
    }
  }
  if (had_error) aom_internal_error_copy(cm->error, &error_info);
}